

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

int htmlSaveFileFormat(char *filename,xmlDocPtr cur,char *encoding,int format)

{
  xmlParserErrors xVar1;
  int iVar2;
  xmlOutputBufferPtr buf;
  char *encoding_00;
  xmlChar *encoding_01;
  char *name;
  xmlCharEncodingHandlerPtr handler;
  xmlCharEncodingHandler *local_30;
  
  local_30 = (xmlCharEncodingHandlerPtr)0x0;
  iVar2 = -1;
  if (filename != (char *)0x0 && cur != (xmlDocPtr)0x0) {
    xmlInitParser();
    name = "HTML";
    if (encoding != (char *)0x0) {
      name = encoding;
    }
    xVar1 = xmlOpenCharEncodingHandler(name,1,&local_30);
    if (xVar1 == XML_ERR_OK) {
      if (local_30 == (xmlCharEncodingHandlerPtr)0x0) {
        encoding_01 = "UTF-8";
      }
      else {
        encoding_01 = (xmlChar *)local_30->name;
      }
      htmlSetMetaEncoding(cur,encoding_01);
      iVar2 = 0;
      buf = xmlOutputBufferCreateFilename(filename,local_30,0);
      if (buf != (xmlOutputBufferPtr)0x0) {
        htmlDocContentDumpFormatOutput(buf,cur,encoding_00,format);
        iVar2 = xmlOutputBufferClose(buf);
      }
    }
  }
  return iVar2;
}

Assistant:

int
htmlSaveFileFormat(const char *filename, xmlDocPtr cur,
	           const char *encoding, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    int ret;

    if ((cur == NULL) || (filename == NULL))
        return(-1);

    xmlInitParser();

    if (htmlFindOutputEncoder(encoding, &handler) != XML_ERR_OK)
        return(-1);
    if (handler != NULL)
        htmlSetMetaEncoding(cur, (const xmlChar *) handler->name);
    else
	htmlSetMetaEncoding(cur, (const xmlChar *) "UTF-8");

    /*
     * save the content to a temp buffer.
     */
    buf = xmlOutputBufferCreateFilename(filename, handler, 0);
    if (buf == NULL)
        return(0);

    htmlDocContentDumpFormatOutput(buf, cur, encoding, format);

    ret = xmlOutputBufferClose(buf);
    return(ret);
}